

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::init(DepthDrawCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  code *pcVar2;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_01;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int extraout_EAX;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *pCVar7;
  NotSupportedError *pNVar8;
  RenderTarget *pRVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  char *pcVar12;
  Context *pCVar13;
  ProgramSources *this_00;
  ShaderProgram *pSVar14;
  TestError *this_01;
  MovePtr *this_02;
  ObjectWrapper *this_03;
  size_type sVar15;
  reference pvVar16;
  reference pvVar17;
  iterator first;
  iterator last;
  char *code;
  float fVar18;
  ShaderProgram *in_stack_fffffffffffff7d8;
  undefined8 in_stack_fffffffffffff7e0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
  *this_04;
  Vector<float,_4> local_6b0;
  Vector<float,_4> local_6a0;
  int local_690;
  undefined1 local_68c [4];
  int layerNdx;
  Random rnd;
  undefined1 local_658 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  ScopedLogSection local_5c8;
  ScopedLogSection section;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_5b8;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_5a8;
  string local_598;
  string local_578;
  ShaderSource local_558;
  string local_530;
  string local_510;
  ShaderSource local_4f0;
  string local_4c8;
  string local_4a8;
  ShaderSource local_488;
  string local_460;
  string local_440;
  ShaderSource local_420;
  undefined1 local_3f8 [8];
  ProgramSources sources;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  MessageBuilder local_300;
  undefined1 local_17d;
  int local_17c;
  string local_178;
  int local_154;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  deUint32 local_24;
  ContextType local_20;
  byte local_19;
  long lStack_18;
  bool supportsES32;
  Functions *gl;
  DepthDrawCase *this_local;
  
  gl = (Functions *)this;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_20.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::es(3,2);
  local_19 = glu::contextSupports(local_20,(ApiType)local_24);
  if (!(bool)local_19) {
    pCVar7 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar7,"GL_EXT_primitive_bounding_box");
    if (!bVar3) {
      local_5d = 1;
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_49);
      tcu::NotSupportedError::NotSupportedError(pNVar8,&local_48);
      local_5d = 0;
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->m_state == STATE_PER_PRIMITIVE) && ((local_19 & 1) == 0)) {
    pCVar7 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar7,"GL_EXT_tessellation_shader");
    if (!bVar3) {
      local_82 = 1;
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Test requires GL_EXT_tessellation_shader extension",&local_81)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar8,&local_80);
      local_82 = 0;
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar9 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getDepthBits(pRVar9);
  if (iVar4 == 0) {
    local_aa = 1;
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Test requires depth buffer",&local_a9);
    tcu::NotSupportedError::NotSupportedError(pNVar8,&local_a8);
    local_aa = 0;
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar9 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar9);
  if (0xff < iVar4) {
    pRVar9 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = tcu::RenderTarget::getHeight(pRVar9);
    if (0xff < iVar4) {
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_300,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_300,
                           (char (*) [70])
                           "Rendering multiple triangle grids with with different z coordinates.\n")
      ;
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [57])
                                   "Topmost grid is green-yellow, other grids are blue-red.\n");
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [53])
                                   "Expecting only the green-yellow grid to be visible.\n");
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [32])"Setting primitive bounding box ");
      local_308 = "to cover";
      if (this->m_bboxSize == BBOX_EQUAL) {
        local_308 = "to exactly cover";
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_308);
      local_310 = " each triangle";
      if (this->m_state == STATE_GLOBAL) {
        local_310 = " each grid";
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_310);
      local_318 = " and include some padding.";
      if (this->m_bboxSize == BBOX_EQUAL) {
        local_318 = ".";
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_318);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b9e07b);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [24])"Set bounding box using ");
      local_320 = "gl_BoundingBoxEXT output";
      if (this->m_state == STATE_GLOBAL) {
        local_320 = "PRIMITIVE_BOUNDING_BOX_EXT state";
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_320);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b9e07b);
      code = "Fragment depth is set in the fragment shader";
      pcVar12 = "";
      if (this->m_depthType == DEPTH_USER_DEFINED) {
        pcVar12 = "Fragment depth is set in the fragment shader";
      }
      sources._200_8_ = pcVar12;
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char **)&sources.separable);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_300);
      glu::ProgramSources::ProgramSources((ProgramSources *)local_3f8);
      pCVar1 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::DepthDrawCase::genVertexSource_abi_cxx11_(&local_460,this);
      pCVar13 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_440,(_anonymous_namespace_ *)pCVar1,pCVar13,code);
      glu::VertexSource::VertexSource((VertexSource *)&local_420,&local_440);
      glu::ProgramSources::operator<<((ProgramSources *)local_3f8,&local_420);
      glu::VertexSource::~VertexSource((VertexSource *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      pCVar1 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::DepthDrawCase::genFragmentSource_abi_cxx11_
                (&local_4c8,this);
      pCVar13 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_4a8,(_anonymous_namespace_ *)pCVar1,pCVar13,code);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_488,&local_4a8);
      glu::ProgramSources::operator<<((ProgramSources *)local_3f8,&local_488);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      if (this->m_state == STATE_PER_PRIMITIVE) {
        pCVar1 = (this->super_TestCase).m_context;
        Functional::(anonymous_namespace)::DepthDrawCase::genTessellationControlSource_abi_cxx11_
                  (&local_530,this);
        pCVar13 = (Context *)std::__cxx11::string::c_str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_510,(_anonymous_namespace_ *)pCVar1,pCVar13,code);
        glu::TessellationControlSource::TessellationControlSource
                  ((TessellationControlSource *)&local_4f0,&local_510);
        this_00 = glu::ProgramSources::operator<<((ProgramSources *)local_3f8,&local_4f0);
        pCVar1 = (this->super_TestCase).m_context;
        Functional::(anonymous_namespace)::DepthDrawCase::genTessellationEvaluationSource_abi_cxx11_
                  (&local_598,this);
        pCVar13 = (Context *)std::__cxx11::string::c_str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_578,(_anonymous_namespace_ *)pCVar1,pCVar13,code);
        glu::TessellationEvaluationSource::TessellationEvaluationSource
                  ((TessellationEvaluationSource *)&local_558,&local_578);
        glu::ProgramSources::operator<<(this_00,&local_558);
        glu::TessellationEvaluationSource::~TessellationEvaluationSource
                  ((TessellationEvaluationSource *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
        glu::TessellationControlSource::~TessellationControlSource
                  ((TessellationControlSource *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_530);
      }
      pSVar14 = (ShaderProgram *)operator_new(0xd0);
      pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ShaderProgram::ShaderProgram(pSVar14,pRVar6,(ProgramSources *)local_3f8);
      de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter
                ((DefaultDeleter<glu::ShaderProgram> *)((long)&section.m_log + 7));
      de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
                ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_5b8)
      ;
      local_5a8 = de::details::MovePtr::operator_cast_to_PtrData(&local_5b8,(MovePtr *)pSVar14);
      data_00._8_8_ = in_stack_fffffffffffff7e0;
      data_00.ptr = in_stack_fffffffffffff7d8;
      de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
                (&this->m_program,data_00);
      de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
                ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_5b8)
      ;
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"build program",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xeca);
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"ShaderProgram",&local_5e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"Shader program",&local_611);
      tcu::ScopedLogSection::ScopedLogSection(&local_5c8,pTVar10,&local_5e8,&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pSVar14 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::operator*(&(this->m_program).
                             super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           );
      glu::operator<<(pTVar10,pSVar14);
      tcu::ScopedLogSection::~ScopedLogSection(&local_5c8);
      pSVar14 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::operator->(&(this->m_program).
                              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                            );
      bVar3 = glu::ShaderProgram::isOk(pSVar14);
      if (!bVar3) {
        data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_638,"failed to build program",
                   (allocator<char> *)
                   ((long)&data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        tcu::TestError::TestError(this_01,&local_638);
        data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_3f8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_658
                );
      generateAttributeData
                (this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_658);
      this_02 = (MovePtr *)operator_new(0x18);
      pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)this_02,pRVar6);
      de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>::DefaultDeleter
                ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_> *)
                 ((long)&rnd.m_rnd.z + 3));
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 *)&rnd.m_rnd.w);
      de::details::MovePtr::operator_cast_to_PtrData
                ((PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                  *)&rnd.m_rnd.w,this_02);
      data_01._8_8_ = in_stack_fffffffffffff7e0;
      data_01.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)in_stack_fffffffffffff7d8;
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::operator=(&this->m_vbo,data_01);
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                  *)&rnd.m_rnd.w);
      pcVar2 = *(code **)(lStack_18 + 0x40);
      this_03 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 ::operator*(&(this->m_vbo).
                              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                            )->super_ObjectWrapper;
      dVar5 = glu::ObjectWrapper::operator*(this_03);
      (*pcVar2)(0x8892,dVar5);
      pcVar2 = *(code **)(lStack_18 + 0x150);
      sVar15 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_658);
      pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_658,0);
      (*pcVar2)(0x8892,(long)((int)sVar15 << 4),pvVar16,0x88e4);
      dVar5 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar5,"buf upload",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xedd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_658
                );
      de::Random::Random((Random *)local_68c,0x12345);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ::resize(&this->m_layers,(long)this->m_numLayers);
      for (local_690 = 0; local_690 < this->m_numLayers; local_690 = local_690 + 1) {
        fVar18 = (float)local_690 / (float)this->m_numLayers;
        pvVar17 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ::operator[](&this->m_layers,(long)local_690);
        pvVar17->zOffset = fVar18 + fVar18 + -1.0;
        iVar4 = this->m_numLayers;
        pvVar17 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ::operator[](&this->m_layers,(long)local_690);
        pvVar17->zScale = 2.0 / (float)iVar4;
        if (local_690 == 0) {
          tcu::Vector<float,_4>::Vector(&local_6a0,0.0,1.0,0.0,1.0);
        }
        else {
          tcu::Vector<float,_4>::Vector(&local_6a0,0.0,0.0,1.0,1.0);
        }
        pvVar17 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ::operator[](&this->m_layers,(long)local_690);
        *(undefined8 *)(pvVar17->color1).m_data = local_6a0.m_data._0_8_;
        *(undefined8 *)((pvVar17->color1).m_data + 2) = local_6a0.m_data._8_8_;
        if (local_690 == 0) {
          tcu::Vector<float,_4>::Vector(&local_6b0,1.0,1.0,0.0,1.0);
        }
        else {
          tcu::Vector<float,_4>::Vector(&local_6b0,1.0,0.0,1.0,1.0);
        }
        pvVar17 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ::operator[](&this->m_layers,(long)local_690);
        *(undefined8 *)(pvVar17->color2).m_data = local_6b0.m_data._0_8_;
        *(undefined8 *)((pvVar17->color2).m_data + 2) = local_6b0.m_data._8_8_;
      }
      this_04 = &this->m_layers;
      first = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
              ::begin(this_04);
      last = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
             ::end(this_04);
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>>>>
                ((Random *)local_68c,
                 (__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>_>
                  )first._M_current,
                 (__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>_>
                  )last._M_current);
      de::Random::~Random((Random *)local_68c);
      return extraout_EAX;
    }
  }
  local_17d = 1;
  pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_154 = 0x100;
  de::toString<int>(&local_150,&local_154);
  std::operator+(&local_130,"Test requires ",&local_150);
  std::operator+(&local_110,&local_130,"x");
  local_17c = 0x100;
  de::toString<int>(&local_178,&local_17c);
  std::operator+(&local_f0,&local_110,&local_178);
  std::operator+(&local_d0,&local_f0," viewport");
  tcu::NotSupportedError::NotSupportedError(pNVar8,&local_d0);
  local_17d = 0;
  __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void DepthDrawCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_state == STATE_PER_PRIMITIVE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (m_context.getRenderTarget().getDepthBits() == 0)
		throw tcu::NotSupportedError("Test requires depth buffer");
	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE || m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " viewport");

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering multiple triangle grids with with different z coordinates.\n"
		<< "Topmost grid is green-yellow, other grids are blue-red.\n"
		<< "Expecting only the green-yellow grid to be visible.\n"
		<< "Setting primitive bounding box "
			<< ((m_bboxSize == BBOX_EQUAL) ? ("to exactly cover") : ("to cover"))
			<< ((m_state == STATE_GLOBAL) ? (" each grid") : (" each triangle"))
			<< ((m_bboxSize == BBOX_EQUAL) ? (".") : (" and include some padding."))
			<< "\n"
		<< "Set bounding box using "
			<< ((m_state == STATE_GLOBAL) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< ((m_depthType == DEPTH_USER_DEFINED) ? ("Fragment depth is set in the fragment shader") : (""))
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_state == STATE_PER_PRIMITIVE)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	{
		std::vector<tcu::Vec4> data;

		generateAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(sizeof(tcu::Vec4) * data.size()), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buf upload");
	}

	// gen layers
	{
		de::Random rnd(0x12345);

		m_layers.resize(m_numLayers);
		for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
		{
			m_layers[layerNdx].zOffset	= ((float)layerNdx / (float)m_numLayers) * 2.0f - 1.0f;
			m_layers[layerNdx].zScale	= (2.0f / (float)m_numLayers);
			m_layers[layerNdx].color1	= (layerNdx == 0) ? (tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));
			m_layers[layerNdx].color2	= (layerNdx == 0) ? (tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f));
		}
		rnd.shuffle(m_layers.begin(), m_layers.end());
	}
}